

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCommandCommand.cxx
# Opt level: O3

cmCommand * __thiscall cmLoadedCommand::Clone(cmLoadedCommand *this)

{
  cmCommand *pcVar1;
  long lVar2;
  cmLoadedCommandInfo *pcVar3;
  cmCommand *pcVar4;
  byte bVar5;
  
  bVar5 = 0;
  pcVar1 = (cmCommand *)operator_new(0x90);
  pcVar1->Makefile = (cmMakefile *)0x0;
  (pcVar1->Error)._M_dataplus._M_p = (pointer)&(pcVar1->Error).field_2;
  (pcVar1->Error)._M_string_length = 0;
  (pcVar1->Error).field_2._M_local_buf[0] = '\0';
  pcVar1->_vptr_cmCommand = (_func_int **)&PTR__cmLoadedCommand_0069cfb8;
  pcVar3 = &this->info;
  pcVar4 = pcVar1 + 1;
  for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
    pcVar4->_vptr_cmCommand = (_func_int **)pcVar3->reserved1;
    pcVar3 = (cmLoadedCommandInfo *)((long)pcVar3 + (ulong)bVar5 * -0x10 + 8);
    pcVar4 = (cmCommand *)((long)pcVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return pcVar1;
}

Assistant:

cmCommand* Clone() override
  {
    cmLoadedCommand* newC = new cmLoadedCommand;
    // we must copy when we clone
    memcpy(&newC->info, &this->info, sizeof(info));
    return newC;
  }